

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O0

Vec_Str_t *
Gia_AigerWriteIntoMemoryStrPart
          (Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Str_t *p_00;
  bool bVar5;
  int local_54;
  int Temp;
  int uLit1;
  int uLit0;
  int uLit;
  int i;
  int nNodes;
  Gia_Obj_t *pObj;
  Vec_Str_t *vBuffer;
  int nRegs_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vAnds_local;
  Vec_Int_t *vCis_local;
  Gia_Man_t *p_local;
  
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  uLit0 = 0;
  uLit = 1;
  while( true ) {
    iVar1 = Vec_IntSize(vCis);
    bVar5 = false;
    if (uLit0 < iVar1) {
      iVar1 = Vec_IntEntry(vCis,uLit0);
      _i = Gia_ManObj(p,iVar1);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsCi(_i);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x3f3,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    _i->Value = uLit;
    uLit0 = uLit0 + 1;
    uLit = uLit + 1;
  }
  uLit0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAnds);
    bVar5 = false;
    if (uLit0 < iVar1) {
      iVar1 = Vec_IntEntry(vAnds,uLit0);
      _i = Gia_ManObj(p,iVar1);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_i);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x3f8,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    _i->Value = uLit;
    uLit0 = uLit0 + 1;
    uLit = uLit + 1;
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_StrAlloc(iVar1 * 3);
  Vec_StrPrintStr(p_00,"aig ");
  iVar1 = Vec_IntSize(vCis);
  iVar2 = Vec_IntSize(vAnds);
  Vec_StrPrintNum(p_00,iVar1 + iVar2);
  Vec_StrPrintStr(p_00," ");
  iVar1 = Vec_IntSize(vCis);
  Vec_StrPrintNum(p_00,iVar1 - nRegs);
  Vec_StrPrintStr(p_00," ");
  Vec_StrPrintNum(p_00,nRegs);
  Vec_StrPrintStr(p_00," ");
  iVar1 = Vec_IntSize(vCos);
  Vec_StrPrintNum(p_00,iVar1 - nRegs);
  Vec_StrPrintStr(p_00," ");
  iVar1 = Vec_IntSize(vAnds);
  Vec_StrPrintNum(p_00,iVar1);
  Vec_StrPrintStr(p_00,"\n");
  uLit0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar5 = false;
    if (uLit0 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,uLit0);
      _i = Gia_ManObj(p,iVar1);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsCo(_i);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x40d,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Vec_IntSize(vCos);
    if (iVar1 - nRegs <= uLit0) {
      pGVar4 = Gia_ObjFanin0(_i);
      iVar1 = Gia_ObjValue(pGVar4);
      iVar2 = Gia_ObjFaninC0(_i);
      iVar1 = Abc_Var2Lit(iVar1,iVar2);
      Vec_StrPrintNum(p_00,iVar1);
      Vec_StrPrintStr(p_00,"\n");
    }
    uLit0 = uLit0 + 1;
  }
  uLit0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar5 = false;
    if (uLit0 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,uLit0);
      _i = Gia_ManObj(p,iVar1);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsCo(_i);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x417,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Vec_IntSize(vCos);
    if (uLit0 < iVar1 - nRegs) {
      pGVar4 = Gia_ObjFanin0(_i);
      iVar1 = Gia_ObjValue(pGVar4);
      iVar2 = Gia_ObjFaninC0(_i);
      iVar1 = Abc_Var2Lit(iVar1,iVar2);
      Vec_StrPrintNum(p_00,iVar1);
      Vec_StrPrintStr(p_00,"\n");
    }
    uLit0 = uLit0 + 1;
  }
  uLit0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAnds);
    bVar5 = false;
    if (uLit0 < iVar1) {
      iVar1 = Vec_IntEntry(vAnds,uLit0);
      _i = Gia_ManObj(p,iVar1);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjValue(_i);
    iVar1 = Abc_Var2Lit(iVar1,0);
    pGVar4 = Gia_ObjFanin0(_i);
    iVar2 = Gia_ObjValue(pGVar4);
    iVar3 = Gia_ObjFaninC0(_i);
    Temp = Abc_Var2Lit(iVar2,iVar3);
    pGVar4 = Gia_ObjFanin1(_i);
    iVar2 = Gia_ObjValue(pGVar4);
    iVar3 = Gia_ObjFaninC1(_i);
    iVar2 = Abc_Var2Lit(iVar2,iVar3);
    if (Temp == iVar2) {
      __assert_fail("uLit0 != uLit1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x425,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    local_54 = iVar2;
    if (iVar2 < Temp) {
      local_54 = Temp;
      Temp = iVar2;
    }
    Gia_AigerWriteUnsigned(p_00,iVar1 - local_54);
    Gia_AigerWriteUnsigned(p_00,local_54 - Temp);
    uLit0 = uLit0 + 1;
  }
  Vec_StrPrintStr(p_00,"c");
  return p_00;
}

Assistant:

Vec_Str_t * Gia_AigerWriteIntoMemoryStrPart( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Vec_Str_t * vBuffer;
    Gia_Obj_t * pObj;
    int nNodes = 0, i, uLit, uLit0, uLit1; 
    // set the node numbers to be used in the output file
    Gia_ManConst0(p)->Value = nNodes++;
    Gia_ManForEachObjVec( vCis, p, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) );
        pObj->Value = nNodes++;
    }
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        pObj->Value = nNodes++;
    }

    // write the header "M I L O A" where M = I + L + A
    vBuffer = Vec_StrAlloc( 3*Gia_ManObjNum(p) );
    Vec_StrPrintStr( vBuffer, "aig " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) + Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCos) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, "\n" );

    // write latch drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i < Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }
    // write output drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i >= Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }

    // write the nodes into the buffer
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        uLit  = Abc_Var2Lit( Gia_ObjValue(pObj), 0 );
        uLit0 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        uLit1 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin1(pObj)), Gia_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Gia_AigerWriteUnsigned( vBuffer, uLit  - uLit1 );
        Gia_AigerWriteUnsigned( vBuffer, uLit1 - uLit0 );
    }
    Vec_StrPrintStr( vBuffer, "c" );
    return vBuffer;
}